

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderPackingFunctionTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::shaderexecutor::UnpackHalf2x16CaseInstance::iterate
          (TestStatus *__return_storage_ptr__,UnpackHalf2x16CaseInstance *this)

{
  pointer *ppVVar1;
  float fVar2;
  bool bVar3;
  StorageType_conflict SVar4;
  StorageType_conflict SVar5;
  deUint32 dVar6;
  size_type sVar7;
  TestLog *pTVar8;
  MessageBuilder *pMVar9;
  ShaderExecutor *pSVar10;
  reference pvVar11;
  reference pvVar12;
  float *pfVar13;
  int local_7ec;
  allocator<char> local_7a9;
  string local_7a8;
  undefined4 local_788;
  allocator<char> local_781;
  string local_780;
  int local_75c;
  MessageBuilder local_758;
  MessageBuilder local_5d8;
  Hex<8UL> local_458;
  Hex<8UL> local_450;
  Hex<8UL> local_448;
  Hex<8UL> local_440;
  Hex<8UL> local_438;
  MessageBuilder local_430;
  int local_2ac;
  int local_2a8;
  int diff1;
  int diff0;
  Float<unsigned_int,_8,_23,_127,_3U> local_29c;
  deUint32 resBits1;
  Float<unsigned_int,_8,_23,_127,_3U> local_294;
  deUint32 resBits0;
  Float<unsigned_int,_8,_23,_127,_3U> local_28c;
  deUint32 refBits1;
  float local_284;
  deUint32 refBits0;
  float res1;
  float res0;
  Float<unsigned_short,_5,_10,_15,_3U> local_272;
  float ref1;
  StorageType_conflict local_26c;
  StorageType_conflict local_26a;
  float ref0;
  deUint16 in1;
  deUint16 in0;
  int valNdx;
  int numFailed;
  int maxPrints;
  int numValues;
  reference local_250;
  void *out;
  void *in;
  MessageBuilder local_238;
  Float<unsigned_short,_5,_10,_15,_3U> local_b8;
  StorageType_conflict local_b6;
  uint local_b4;
  int iStack_b0;
  deUint16 value;
  deUint32 mantissa;
  int exp;
  int s;
  int c;
  deUint32 inVal;
  int ndx;
  int mantBits;
  int maxExp;
  int minExp;
  Float<unsigned_short,_5,_10,_15,_3U> local_88;
  Float<unsigned_short,_5,_10,_15,_3U> local_86;
  value_type_conflict2 local_84;
  Float<unsigned_short,_5,_10,_15,_3U> local_80;
  Float<unsigned_short,_5,_10,_15,_3U> local_7e;
  value_type_conflict2 local_7c;
  Float<unsigned_short,_5,_10,_15,_3U> local_76 [8];
  Float<unsigned_short,_5,_10,_15,_3U> local_66;
  value_type_conflict2 local_64;
  undefined1 local_60 [8];
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> outputs;
  vector<unsigned_int,_std::allocator<unsigned_int>_> inputs;
  Random rnd;
  int maxDiff;
  UnpackHalf2x16CaseInstance *this_local;
  
  rnd.m_rnd.z = 0;
  unique0x10001367 = this;
  dVar6 = deStringHash((this->super_ShaderPackingFunctionTestInstance).m_name);
  de::Random::Random((Random *)
                     ((long)&inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 4),dVar6 ^ 0x776002
                    );
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &outputs.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)local_60);
  tcu::Float<unsigned_short,_5,_10,_15,_3U>::Float(&local_66,0.0);
  SVar4 = tcu::Float<unsigned_short,_5,_10,_15,_3U>::bits(&local_66);
  tcu::Float<unsigned_short,_5,_10,_15,_3U>::Float(local_76,1.0);
  SVar5 = tcu::Float<unsigned_short,_5,_10,_15,_3U>::bits(local_76);
  local_64 = CONCAT22(SVar4,SVar5);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &outputs.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&local_64);
  tcu::Float<unsigned_short,_5,_10,_15,_3U>::Float(&local_7e,1.0);
  SVar4 = tcu::Float<unsigned_short,_5,_10,_15,_3U>::bits(&local_7e);
  tcu::Float<unsigned_short,_5,_10,_15,_3U>::Float(&local_80,0.0);
  SVar5 = tcu::Float<unsigned_short,_5,_10,_15,_3U>::bits(&local_80);
  local_7c = CONCAT22(SVar4,SVar5);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &outputs.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&local_7c);
  tcu::Float<unsigned_short,_5,_10,_15,_3U>::Float(&local_86,-1.0);
  SVar4 = tcu::Float<unsigned_short,_5,_10,_15,_3U>::bits(&local_86);
  tcu::Float<unsigned_short,_5,_10,_15,_3U>::Float(&local_88,0.5);
  SVar5 = tcu::Float<unsigned_short,_5,_10,_15,_3U>::bits(&local_88);
  local_84 = CONCAT22(SVar4,SVar5);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &outputs.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&local_84);
  tcu::Float<unsigned_short,_5,_10,_15,_3U>::Float
            ((Float<unsigned_short,_5,_10,_15,_3U> *)((long)&maxExp + 2),0.5);
  SVar4 = tcu::Float<unsigned_short,_5,_10,_15,_3U>::bits
                    ((Float<unsigned_short,_5,_10,_15,_3U> *)((long)&maxExp + 2));
  tcu::Float<unsigned_short,_5,_10,_15,_3U>::Float
            ((Float<unsigned_short,_5,_10,_15,_3U> *)&maxExp,-0.5);
  SVar5 = tcu::Float<unsigned_short,_5,_10,_15,_3U>::bits
                    ((Float<unsigned_short,_5,_10,_15,_3U> *)&maxExp);
  minExp = CONCAT22(SVar4,SVar5);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &outputs.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(value_type_conflict2 *)&minExp);
  mantBits = -0xe;
  ndx = 0xf;
  inVal = 10;
  for (c = 0; c < 0x60; c = c + 1) {
    s = 0;
    for (exp = 0; exp < 2; exp = exp + 1) {
      bVar3 = de::Random::getBool((Random *)
                                  ((long)&inputs.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      mantissa = bVar3 - 1 | 1;
      iStack_b0 = de::Random::getInt((Random *)
                                     ((long)&inputs.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4)
                                     ,-0xe,0xf);
      dVar6 = de::Random::getUint32
                        ((Random *)
                         ((long)&inputs.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      local_b4 = dVar6 & 0x3ff;
      if (iStack_b0 == 0) {
        local_7ec = 1;
      }
      else {
        local_7ec = iStack_b0;
      }
      local_b8 = tcu::Float<unsigned_short,_5,_10,_15,_3U>::construct
                           (mantissa,local_7ec,(ushort)local_b4 | 0x400);
      local_b6 = tcu::Float<unsigned_short,_5,_10,_15,_3U>::bits(&local_b8);
      s = (uint)local_b6 << ((byte)(exp << 4) & 0x1f) | s;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &outputs.
                super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,(value_type_conflict2 *)&s);
  }
  sVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &outputs.
                      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::resize
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)local_60,
             sVar7);
  pTVar8 = tcu::TestContext::getLog((this->super_ShaderPackingFunctionTestInstance).m_testCtx);
  tcu::TestLog::operator<<(&local_238,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar9 = tcu::MessageBuilder::operator<<(&local_238,(char (*) [22])"Executing shader for ");
  in = (void *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          &outputs.
                           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(unsigned_long *)&in);
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [14])" input values");
  tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_238);
  ppVVar1 = &outputs.
             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  out = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)ppVVar1,0);
  local_250 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
              operator[]((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                         local_60,0);
  pSVar10 = de::details::
            UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
            ::operator->(&(this->super_ShaderPackingFunctionTestInstance).m_executor.
                          super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
                        );
  sVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)ppVVar1);
  ::vk::Handle<(vk::HandleType)22>::Handle((Handle<(vk::HandleType)22> *)&maxPrints,0);
  (*pSVar10->_vptr_ShaderExecutor[2])(pSVar10,sVar7 & 0xffffffff,&out,&local_250,_maxPrints);
  sVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &outputs.
                      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  numFailed = (int)sVar7;
  valNdx = 10;
  _in1 = 0;
  for (ref0 = 0.0; fVar2 = ref0,
      sVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &outputs.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage),
      (int)fVar2 < (int)sVar7; ref0 = (float)((int)ref0 + 1)) {
    ppVVar1 = &outputs.
               super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)ppVVar1,
                         (long)(int)ref0);
    local_26a = (StorageType_conflict)*pvVar11;
    pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)ppVVar1,
                         (long)(int)ref0);
    local_26c = *(StorageType_conflict *)((long)pvVar11 + 2);
    tcu::Float<unsigned_short,_5,_10,_15,_3U>::Float(&local_272,local_26a);
    ref1 = tcu::Float<unsigned_short,_5,_10,_15,_3U>::asFloat(&local_272);
    tcu::Float<unsigned_short,_5,_10,_15,_3U>::Float
              ((Float<unsigned_short,_5,_10,_15,_3U> *)((long)&res1 + 2),local_26c);
    res0 = tcu::Float<unsigned_short,_5,_10,_15,_3U>::asFloat
                     ((Float<unsigned_short,_5,_10,_15,_3U> *)((long)&res1 + 2));
    pvVar12 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
              operator[]((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                         local_60,(long)(int)ref0);
    pfVar13 = tcu::Vector<float,_2>::x(pvVar12);
    refBits0 = (deUint32)*pfVar13;
    pvVar12 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
              operator[]((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                         local_60,(long)(int)ref0);
    pfVar13 = tcu::Vector<float,_2>::y(pvVar12);
    local_284 = *pfVar13;
    tcu::Float<unsigned_int,_8,_23,_127,_3U>::Float(&local_28c,ref1);
    refBits1 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::bits(&local_28c);
    tcu::Float<unsigned_int,_8,_23,_127,_3U>::Float(&local_294,res0);
    resBits0 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::bits(&local_294);
    tcu::Float<unsigned_int,_8,_23,_127,_3U>::Float(&local_29c,(float)refBits0);
    resBits1 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::bits(&local_29c);
    tcu::Float<unsigned_int,_8,_23,_127,_3U>::Float
              ((Float<unsigned_int,_8,_23,_127,_3U> *)&diff1,local_284);
    diff0 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::bits
                      ((Float<unsigned_int,_8,_23,_127,_3U> *)&diff1);
    local_2a8 = de::abs<int>(refBits1 - resBits1);
    local_2ac = de::abs<int>(resBits0 - diff0);
    if ((0 < local_2a8) || (0 < local_2ac)) {
      if (_in1 < 10) {
        pTVar8 = tcu::TestContext::getLog((this->super_ShaderPackingFunctionTestInstance).m_testCtx)
        ;
        tcu::TestLog::operator<<(&local_430,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar9 = tcu::MessageBuilder::operator<<
                           (&local_430,(char (*) [26])"ERROR: Mismatch in value ");
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(int *)&ref0);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x137d35a);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [27])"  expected unpackHalf2x16(")
        ;
        pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                             &outputs.
                              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)(int)ref0);
        local_438 = tcu::toHex<unsigned_int>(*pvVar11);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_438);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [5])0x131b1b7);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [6])0x138a6b5);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&ref1);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [4])" / ");
        local_440 = tcu::toHex<unsigned_int>(refBits1);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_440);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x136aa81);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&res0);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [4])" / ");
        local_448 = tcu::toHex<unsigned_int>(resBits0);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_448);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [2])0x13159c9);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [12])", got vec2(");
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(float *)&refBits0);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [4])" / ");
        local_450 = tcu::toHex<unsigned_int>(resBits1);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_450);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x136aa81);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_284);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [4])" / ");
        local_458 = tcu::toHex<unsigned_int>(diff0);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_458);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [2])0x13159c9);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [17])"\n  ULP diffs = (");
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_2a8);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x136aa81);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_2ac);
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [15])"), max diff = ");
        pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(int *)&rnd.m_rnd.z);
        tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_430);
      }
      else if (_in1 == 10) {
        pTVar8 = tcu::TestContext::getLog((this->super_ShaderPackingFunctionTestInstance).m_testCtx)
        ;
        tcu::TestLog::operator<<(&local_5d8,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar9 = tcu::MessageBuilder::operator<<(&local_5d8,(char (*) [4])"...");
        tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_5d8);
      }
      _in1 = _in1 + 1;
    }
  }
  pTVar8 = tcu::TestContext::getLog((this->super_ShaderPackingFunctionTestInstance).m_testCtx);
  tcu::TestLog::operator<<(&local_758,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
  local_75c = numFailed - _in1;
  pMVar9 = tcu::MessageBuilder::operator<<(&local_758,&local_75c);
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [4])" / ");
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&numFailed);
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [15])" values passed");
  tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_758);
  if (_in1 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_780,"Pass",&local_781);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_780);
    std::__cxx11::string::~string((string *)&local_780);
    std::allocator<char>::~allocator(&local_781);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7a8,"Result comparison failed",&local_7a9);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_7a8);
    std::__cxx11::string::~string((string *)&local_7a8);
    std::allocator<char>::~allocator(&local_7a9);
  }
  local_788 = 1;
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::~vector
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)local_60);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &outputs.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  de::Random::~Random((Random *)
                      ((long)&inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus iterate (void)
	{
		const int					maxDiff		= 0; // All bits must be accurate.
		de::Random					rnd			(deStringHash(m_name) ^ 0x776002);
		std::vector<deUint32>		inputs;
		std::vector<tcu::Vec2>		outputs;

		// Special values.
		inputs.push_back((tcu::Float16( 0.0f).bits() << 16) | tcu::Float16( 1.0f).bits());
		inputs.push_back((tcu::Float16( 1.0f).bits() << 16) | tcu::Float16( 0.0f).bits());
		inputs.push_back((tcu::Float16(-1.0f).bits() << 16) | tcu::Float16( 0.5f).bits());
		inputs.push_back((tcu::Float16( 0.5f).bits() << 16) | tcu::Float16(-0.5f).bits());

		// Construct random values.
		{
			const int	minExp		= -14;
			const int	maxExp		= 15;
			const int	mantBits	= 10;

			for (int ndx = 0; ndx < 96; ndx++)
			{
				deUint32 inVal = 0;
				for (int c = 0; c < 2; c++)
				{
					const int		s			= rnd.getBool() ? 1 : -1;
					const int		exp			= rnd.getInt(minExp, maxExp);
					const deUint32	mantissa	= rnd.getUint32() & ((1<<mantBits)-1);
					const deUint16	value		= tcu::Float16::construct(s, exp ? exp : 1 /* avoid denorm */, (deUint16)((1u<<10) | mantissa)).bits();

					inVal |= value << (16*c);
				}
				inputs.push_back(inVal);
			}
		}

		outputs.resize(inputs.size());

		m_testCtx.getLog() << TestLog::Message << "Executing shader for " << inputs.size() << " input values" << tcu::TestLog::EndMessage;

		{
			const void*	in	= &inputs[0];
			void*		out	= &outputs[0];

			m_executor->execute((int)inputs.size(), &in, &out);
		}

		// Verify
		{
			const int	numValues	= (int)inputs.size();
			const int	maxPrints	= 10;
			int			numFailed	= 0;

			for (int valNdx = 0; valNdx < (int)inputs.size(); valNdx++)
			{
				const deUint16	in0			= (deUint16)(inputs[valNdx] & 0xffff);
				const deUint16	in1			= (deUint16)(inputs[valNdx] >> 16);
				const float		ref0		= tcu::Float16(in0).asFloat();
				const float		ref1		= tcu::Float16(in1).asFloat();
				const float		res0		= outputs[valNdx].x();
				const float		res1		= outputs[valNdx].y();

				const deUint32	refBits0	= tcu::Float32(ref0).bits();
				const deUint32	refBits1	= tcu::Float32(ref1).bits();
				const deUint32	resBits0	= tcu::Float32(res0).bits();
				const deUint32	resBits1	= tcu::Float32(res1).bits();

				const int		diff0	= de::abs((int)refBits0 - (int)resBits0);
				const int		diff1	= de::abs((int)refBits1 - (int)resBits1);

				if (diff0 > maxDiff || diff1 > maxDiff)
				{
					if (numFailed < maxPrints)
					{
						m_testCtx.getLog() << TestLog::Message << "ERROR: Mismatch in value " << valNdx << ",\n"
															   << "  expected unpackHalf2x16(" << tcu::toHex(inputs[valNdx]) << ") = "
															   << "vec2(" << ref0 << " / " << tcu::toHex(refBits0) << ", " << ref1 << " / " << tcu::toHex(refBits1) << ")"
															   << ", got vec2(" << res0 << " / " << tcu::toHex(resBits0) << ", " << res1 << " / " << tcu::toHex(resBits1) << ")"
															   << "\n  ULP diffs = (" << diff0 << ", " << diff1 << "), max diff = " << maxDiff
										   << TestLog::EndMessage;
					}
					else if (numFailed == maxPrints)
						m_testCtx.getLog() << TestLog::Message << "..." << TestLog::EndMessage;

					numFailed += 1;
				}
			}

			m_testCtx.getLog() << TestLog::Message << (numValues - numFailed) << " / " << numValues << " values passed" << TestLog::EndMessage;

			if (numFailed == 0)
				return tcu::TestStatus::pass("Pass");
			else
				return tcu::TestStatus::fail("Result comparison failed");

		}
	}